

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericValidator.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::AbstractNumericValidator::isSerializable(AbstractNumericValidator *this)

{
  AbstractNumericValidator *this_local;
  
  return true;
}

Assistant:

void AbstractNumericValidator::serialize(XSerializeEngine& serEng)
{
    AbstractNumericFacetValidator::serialize(serEng);

    /***
     * Need not to do anything else here
     *
     * Note: its derivatives, Doubledv, Floatdv and Decimaldv writes
     *       number type info into the binary data stream to be read
     *       by AbstractNumericFacetVaildator during loading, therefore
     *       this class can NOT write/read anything into/from the binary
     *       data stream.
     *
     *       Later on, if this class has to write/read something into/from
     *       the binary data stream, we need to add a numberType data
     *       to XMLNumber and let AbstractNumericFacetValidator to write/read
     *       this number type info.
     ***/
}